

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_test_driver.cc
# Opt level: O3

void __thiscall
libaom_test::DecoderTest::RunLoop
          (DecoderTest *this,CompressedVideoSource *video,aom_codec_dec_cfg_t *dec_cfg)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Decoder *pDVar3;
  char cVar4;
  size_type sVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  aom_codec_err_t aVar9;
  uint uVar10;
  undefined4 extraout_var;
  long lVar11;
  uint8_t *puVar12;
  size_t sVar13;
  undefined4 extraout_var_00;
  char *__s;
  size_t sVar14;
  aom_image_t *paVar15;
  undefined8 *puVar16;
  ulong uVar17;
  aom_codec_ctx_t *ctx;
  ostream *poVar18;
  SEARCH_METHODS *pSVar19;
  char *in_R9;
  Decoder *decoder;
  aom_codec_err_t res_dec;
  DxDataIterator dec_iter;
  aom_codec_stream_info_t stream_info;
  Decoder *local_98;
  AssertHelper local_90;
  undefined8 *local_88;
  AssertHelper local_80;
  AssertHelper local_78;
  string local_70;
  ulong local_50;
  long *local_48 [2];
  uint local_34;
  
  uVar1._0_4_ = dec_cfg->threads;
  uVar1._4_4_ = dec_cfg->w;
  uVar2._0_4_ = dec_cfg->h;
  uVar2._4_4_ = dec_cfg->allow_lowbitdepth;
  iVar8 = (*this->codec_->_vptr_CodecFactory[3])(this->codec_,uVar1,uVar2,this->flags_);
  local_98 = (Decoder *)CONCAT44(extraout_var,iVar8);
  local_48[0] = (long *)0x0;
  testing::internal::CmpHelperNE<libaom_test::Decoder*,decltype(nullptr)>
            ((internal *)&local_70,"decoder","nullptr",&local_98,local_48);
  sVar5 = local_70._M_string_length;
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_48);
    if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
      pSVar19 = "";
    }
    else {
      pSVar19 = *(SEARCH_METHODS **)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/decode_test_driver.cc"
               ,0x3b,(char *)pSVar19);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    puVar16 = (undefined8 *)local_70._M_string_length;
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48[0] !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*local_48[0] + 8))();
      puVar16 = (undefined8 *)local_70._M_string_length;
    }
LAB_0012c28f:
    if (puVar16 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar16 != puVar16 + 2) {
        operator_delete((undefined8 *)*puVar16);
      }
      operator_delete(puVar16);
    }
  }
  else {
    if ((undefined8 *)local_70._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_70._M_string_length !=
          (undefined8 *)(local_70._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_70._M_string_length);
      }
      operator_delete((void *)sVar5);
    }
    (**(code **)(*(long *)video + 0x18))(video);
    bVar6 = testing::Test::HasFatalFailure();
    if (!bVar6) {
      bVar6 = false;
      uVar17 = 0;
      do {
        bVar7 = testing::Test::HasNonfatalFailure();
        if ((bVar7) || ((uVar17 & 1) != 0)) break;
        (*this->_vptr_DecoderTest[4])(this,video,local_98);
        local_34 = 0;
        lVar11 = (**(code **)(*(long *)video + 0x28))(video);
        pDVar3 = local_98;
        uVar17 = CONCAT71((int7)(uVar17 >> 8),lVar11 == 0);
        if (lVar11 == 0) {
          local_80.data_._0_4_ = Decoder::DecodeFrame(local_98,(uint8_t *)0x0,0,(void *)0x0);
          local_90.data_._0_4_ = 0;
          testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                    ((internal *)&local_70,"AOM_CODEC_OK","res_dec",(aom_codec_err_t *)&local_90,
                     (aom_codec_err_t *)&local_80);
          cVar4 = (char)local_70._M_dataplus._M_p;
          if ((char)local_70._M_dataplus._M_p == '\0') {
            local_50 = uVar17;
            testing::Message::Message((Message *)&local_90);
            ctx = &local_98->decoder_;
            __s = aom_codec_error_detail(ctx);
            if (__s == (char *)0x0) {
              __s = aom_codec_error(ctx);
              poVar18 = (ostream *)(CONCAT44(local_90.data_._4_4_,(uint)local_90.data_) + 0x10);
              if (__s != (char *)0x0) goto LAB_0012c119;
              sVar14 = 6;
              __s = "(null)";
            }
            else {
              poVar18 = (ostream *)(CONCAT44(local_90.data_._4_4_,(uint)local_90.data_) + 0x10);
LAB_0012c119:
              sVar14 = strlen(__s);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar18,__s,sVar14);
            pSVar19 = "";
            if ((undefined8 *)local_70._M_string_length != (undefined8 *)0x0) {
              pSVar19 = *(SEARCH_METHODS **)local_70._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_78,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/decode_test_driver.cc"
                       ,0x59,(char *)pSVar19);
            uVar17 = local_50;
            testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
            testing::internal::AssertHelper::~AssertHelper(&local_78);
            if ((long *)CONCAT44(local_90.data_._4_4_,(uint)local_90.data_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,(uint)local_90.data_) + 8))();
            }
          }
          sVar5 = local_70._M_string_length;
          if ((undefined8 *)local_70._M_string_length != (undefined8 *)0x0) {
            if (*(undefined8 **)local_70._M_string_length !=
                (undefined8 *)(local_70._M_string_length + 0x10)) {
              operator_delete(*(undefined8 **)local_70._M_string_length);
            }
            operator_delete((void *)sVar5);
          }
          if (cVar4 == '\0') {
            return;
          }
        }
        else {
          if (!bVar6) {
            local_50 = uVar17;
            puVar12 = (uint8_t *)(**(code **)(*(long *)video + 0x28))(video);
            sVar13 = (**(code **)(*(long *)video + 0x30))(video);
            iVar8 = (*pDVar3->_vptr_Decoder[2])(pDVar3);
            aom_codec_peek_stream_info
                      ((aom_codec_iface_t *)CONCAT44(extraout_var_00,iVar8),puVar12,sVar13,
                       (aom_codec_stream_info_t *)local_48);
            (*this->_vptr_DecoderTest[7])(this,local_98,video);
            bVar6 = testing::Test::HasFatalFailure();
            if (bVar6) {
              local_90.data_._0_4_ = (uint)local_90.data_ & 0xffffff00;
            }
            else {
              bVar6 = testing::Test::HasNonfatalFailure();
              local_90.data_._0_4_ = CONCAT31(local_90.data_._1_3_,!bVar6);
              local_88 = (undefined8 *)0x0;
              uVar17 = local_50;
              if (!bVar6) goto LAB_0012c033;
            }
            local_88 = (undefined8 *)0x0;
            testing::Message::Message((Message *)&local_78);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_70,(internal *)&local_90,
                       (AssertionResult *)"::testing::Test::HasFailure()","true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_80,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/decode_test_driver.cc"
                       ,0x4f,local_70._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
            testing::internal::AssertHelper::~AssertHelper(&local_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            puVar16 = local_88;
            if (local_78.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_78.data_ + 8))();
              puVar16 = local_88;
            }
            goto LAB_0012c28f;
          }
LAB_0012c033:
          pDVar3 = local_98;
          puVar12 = (uint8_t *)(**(code **)(*(long *)video + 0x28))(video);
          sVar13 = (**(code **)(*(long *)video + 0x30))(video);
          aVar9 = Decoder::DecodeFrame(pDVar3,puVar12,sVar13,(void *)0x0);
          iVar8 = (*this->_vptr_DecoderTest[5])(this,(ulong)aVar9,video);
          bVar6 = true;
          if ((char)iVar8 == '\0') break;
        }
        local_70._M_dataplus._M_p = (pointer)&local_98->decoder_;
        local_70._M_string_length = 0;
        while (((bVar7 = testing::Test::HasFatalFailure(), !bVar7 &&
                (bVar7 = testing::Test::HasNonfatalFailure(), !bVar7)) &&
               (paVar15 = aom_codec_get_frame((aom_codec_ctx_t *)local_70._M_dataplus._M_p,
                                              (aom_codec_iter_t *)&local_70._M_string_length),
               paVar15 != (aom_image_t *)0x0))) {
          uVar10 = (**(code **)(*(long *)video + 0x38))(video);
          (*this->_vptr_DecoderTest[6])(this,paVar15,(ulong)uVar10);
        }
        (**(code **)(*(long *)video + 0x20))(video);
        bVar7 = testing::Test::HasFatalFailure();
      } while (!bVar7);
    }
    if (local_98 != (Decoder *)0x0) {
      (*local_98->_vptr_Decoder[1])();
    }
  }
  return;
}

Assistant:

void DecoderTest::RunLoop(CompressedVideoSource *video,
                          const aom_codec_dec_cfg_t &dec_cfg) {
  Decoder *const decoder = codec_->CreateDecoder(dec_cfg, flags_);
  ASSERT_NE(decoder, nullptr);
  bool end_of_file = false;
  bool peeked_stream = false;

  // Decode frames.
  for (video->Begin(); !::testing::Test::HasFailure() && !end_of_file;
       video->Next()) {
    PreDecodeFrameHook(*video, decoder);

    aom_codec_stream_info_t stream_info;
    stream_info.is_annexb = 0;

    if (video->cxdata() != nullptr) {
      if (!peeked_stream) {
        // TODO(yaowu): PeekStream returns error for non-sequence_header_obu,
        // therefore should only be tried once per sequence, this shall be fixed
        // once PeekStream is updated to properly operate on other obus.
        const aom_codec_err_t res_peek = decoder->PeekStream(
            video->cxdata(), video->frame_size(), &stream_info);
        HandlePeekResult(decoder, video, res_peek);
        ASSERT_FALSE(::testing::Test::HasFailure());
        peeked_stream = true;
      }

      aom_codec_err_t res_dec =
          decoder->DecodeFrame(video->cxdata(), video->frame_size());
      if (!HandleDecodeResult(res_dec, *video, decoder)) break;
    } else {
      // Signal end of the file to the decoder.
      const aom_codec_err_t res_dec = decoder->DecodeFrame(nullptr, 0);
      ASSERT_EQ(AOM_CODEC_OK, res_dec) << decoder->DecodeError();
      end_of_file = true;
    }

    DxDataIterator dec_iter = decoder->GetDxData();
    const aom_image_t *img = nullptr;

    // Get decompressed data
    while (!::testing::Test::HasFailure() && (img = dec_iter.Next()))
      DecompressedFrameHook(*img, video->frame_number());
  }
  delete decoder;
}